

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O1

void master_table_delete_dictionary
               (planck_unit_test_t *tc,MasterTable *master_table,Dictionary<int,_int> *dictionary)

{
  ion_dictionary_id_t id;
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t local_30;
  
  id = ((dictionary->dict).instance)->id;
  iVar1 = MasterTable::deleteDictionary<int,int>(master_table,dictionary);
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,0,(int)iVar1,0xc9,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar2 != '\0') {
    iVar1 = ion_lookup_in_master_table(id,&local_30);
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,1,(int)iVar1,0xce,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar2 != '\0') {
      return;
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
master_table_delete_dictionary(
	planck_unit_test_t *tc,
	MasterTable *master_table,
	Dictionary<int, int>	*dictionary
) {
	ion_dictionary_id_t id	= dictionary->dict.instance->id;

	ion_err_t err			= master_table->deleteDictionary(dictionary);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);

	ion_dictionary_config_info_t config;

	err = master_table->lookupMasterTable(id, &config);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_item_not_found, err);
}